

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O2

Pass * wasm::createHeapStoreOptimizationPass(void)

{
  HeapStoreOptimization *this;
  
  this = (HeapStoreOptimization *)operator_new(0x408);
  memset(this,0,0x408);
  anon_unknown_166::HeapStoreOptimization::HeapStoreOptimization(this);
  return (Pass *)this;
}

Assistant:

Pass* createHeapStoreOptimizationPass() { return new HeapStoreOptimization(); }